

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::ServiceDescriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,ServiceDescriptor *this)

{
  ServiceDescriptor *this_local;
  string *contents;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  DebugString(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ServiceDescriptor::DebugString() const {
  string contents;
  DebugString(&contents);
  return contents;
}